

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScanSSA.h
# Opt level: O2

Interval * __thiscall Interval::split(Interval *__return_storage_ptr__,Interval *this,int position)

{
  pointer ppVar1;
  int iVar2;
  pointer ppVar3;
  pair<int,_int> pair1;
  
  if (this->_fixed == true) {
    __assert_fail("!isFixed() && \"Fixed interval is not splittable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhuez16[P]bazinga_compiler/include/codegen/LinearScanSSA.h"
                  ,0x61,"Interval Interval::split(int)");
  }
  Interval(__return_storage_ptr__);
  ppVar1 = (this->_intervals).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->_intervals).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    iVar2 = ppVar3->first;
    if ((iVar2 <= position) && (iVar2 != ppVar3->second && position <= ppVar3->second))
    goto LAB_0016d844;
  }
LAB_0016d882:
  __return_storage_ptr__->_v = this->_v;
  return __return_storage_ptr__;
LAB_0016d844:
  while (ppVar1[-1].first != iVar2) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::insert
              (&__return_storage_ptr__->_intervals,
               (__return_storage_ptr__->_intervals).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,ppVar1 + -1);
    ppVar1 = (this->_intervals).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    (this->_intervals).
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar1;
    iVar2 = ppVar3->first;
  }
  pair1.second = position + -1;
  pair1.first = iVar2;
  (this->_intervals).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            (&this->_intervals,&pair1);
  addRange(__return_storage_ptr__,position,this->_end);
  this->_end = position + -1;
  goto LAB_0016d882;
}

Assistant:

Interval split(int position){
        assert(!isFixed() && "Fixed interval is not splittable");
        // if (position < 0) assert(0);
        // setSpill(position);
        Interval P1;
        for (auto it = _intervals.begin(); it != _intervals.end(); ++it){
            if (it->first <= position && it->second >= position && it->first!=it->second){
//                addRange(it->first,position-1);
//                addRange(position,it->second);
                while (_intervals.back().first != it->first){
                    P1._intervals.insert(P1._intervals.begin(),_intervals.back());
                    _intervals.pop_back();
                }
                auto pair1=std::make_pair(it->first,position-1);
                _intervals.pop_back();
                _intervals.push_back(pair1);
                P1.addRange(position,this->_end);
                this->_end=position-1;
                break;
            }
        }
        P1.setValue(getValue());
        // P1._begin=position;
//        while (this->_intervals.back().first >= position) this->_intervals.pop_back();
//        this->_end=position-1;
//        P1.setValue(getValue());
//        P1.setRegister(-1);
//        P1.setSpill(-1);
        return P1;
    }